

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

timer_ticks __thiscall timer::get_elapsed_us(timer *this)

{
  long lVar1;
  long *in_RDI;
  timer_ticks delta;
  timer_ticks stop_time;
  timer_ticks *in_stack_ffffffffffffffe0;
  ulong local_8;
  
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    local_8 = 0;
  }
  else {
    lVar1 = in_RDI[1];
    if ((*(byte *)(in_RDI + 2) >> 1 & 1) == 0) {
      query_counter(in_stack_ffffffffffffffe0);
    }
    local_8 = ((lVar1 - *in_RDI) * 1000000 + (g_freq >> 1)) / g_freq;
  }
  return local_8;
}

Assistant:

timer_ticks timer::get_elapsed_us() const
{
   assert(m_started);
   if (!m_started)
      return 0;

   timer_ticks stop_time = m_stop_time;
   if (!m_stopped)
      query_counter(&stop_time);

   timer_ticks delta = stop_time - m_start_time;
   return (delta * 1000000ULL + (g_freq >> 1U)) / g_freq;
}